

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O3

void __thiscall RealApplyDiff::test_method(RealApplyDiff *this)

{
  bool bVar1;
  Index outer_stride;
  double *pdVar2;
  undefined8 *puVar3;
  char *pcVar4;
  Index cols;
  size_t size;
  VectorXd x;
  MatrixXd expectedRes;
  MatrixXd Jf;
  RealSpace Space;
  Matrix<double,__1,__1,_0,__1,__1> local_2d8;
  void *local_2c0;
  undefined8 uStack_2b8;
  undefined **local_2b0;
  void *local_2a8;
  Matrix<double,__1,__1,_0,__1,__1> local_2a0;
  Matrix<double,__1,__1,_0,__1,__1> local_288;
  Matrix<double,__1,__1,_0,__1,__1> local_268;
  char *local_250;
  char *local_248;
  RealScalar local_240;
  double *local_238;
  undefined8 local_230;
  double *local_228;
  undefined8 local_220;
  undefined **local_210;
  void *local_208;
  undefined **local_1f8;
  void *pvStack_1f0;
  undefined8 *local_1e8;
  assign_op<double,_double> *paStack_1e0;
  undefined8 uStack_1d8;
  void *local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  code *local_c8 [11];
  void *local_70;
  void *local_60;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_c8,7);
  pdVar2 = (double *)mnf::Manifold::dim();
  pvStack_1f0 = (void *)mnf::Manifold::representationDim();
  local_1f8 = (undefined **)0x5;
  if ((long)pvStack_1f0 < 0) {
    pcVar4 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_001136bc:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar4);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_268,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_1f8);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2b0,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_2d8);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&paStack_1e0);
  free(pvStack_1f0);
  local_210 = local_2b0;
  local_208 = local_2a8;
  if ((long)local_2a8 < 0 && local_2b0 != (undefined **)0x0) {
    pcVar4 = 
    "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
  else {
    paStack_1e0 = (assign_op<double,_double> *)0x0;
    uStack_1d8 = 0;
    local_1f8 = local_2b0;
    pvStack_1f0 = local_2a8;
    local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         pdVar2;
    if ((long)pdVar2 < 0) {
      pcVar4 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_001136bc;
    }
    local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    local_2c0 = (void *)0x0;
    uStack_2b8 = 0;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    construct<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_2d8,
               &local_288);
    mnf::Manifold::retractation(local_c8,&local_210,&local_1f8,&local_2d8);
    free(local_2c0);
    free(paStack_1e0);
    local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    paStack_1e0 = (assign_op<double,_double> *)0x0;
    uStack_1d8 = 0;
    local_1f8 = local_2b0;
    pvStack_1f0 = local_2a8;
    if (-1 < (long)local_2a8 || local_2b0 == (undefined **)0x0) {
      mnf::Manifold::diffRetractation((Ref_conflict *)&local_2a0);
      if (local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols != local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                     );
      }
      local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      if ((local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows | local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols) != 0) {
        if ((local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows | local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols) < 0) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                       );
        }
        if ((local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows != 0 &&
             (double *)
             local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols != (double *)0x0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                   SEXT816(local_2a0.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols),0) <
            local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows)) {
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = std::ostream::_M_insert<long>;
          __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        size = local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols * local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
        if (size != 0) {
          if ((long)size < 1) {
            local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (double *)0x0;
          }
          else {
            local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = Eigen::internal::conditional_aligned_new_auto<double,true>(size);
          }
        }
        local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
        local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             = local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols;
      }
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>(&local_2d8,&local_268,&local_2a0);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&local_288,&local_2d8,(assign_op<double,_double> *)&local_250);
      free(local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(paStack_1e0);
      local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      if ((double *)0x1999999999999999 < pdVar2) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = std::ostream::_M_insert<long>;
        __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if (pdVar2 != (double *)0x0) {
        local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = Eigen::internal::conditional_aligned_new_auto<double,true>((long)pdVar2 * 5);
      }
      local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           5;
      local_230 = 5;
      local_220 = 5;
      local_1e8 = (undefined8 *)0x0;
      paStack_1e0 = (assign_op<double,_double> *)0x0;
      local_1f8 = (undefined **)0x0;
      pvStack_1f0 = (void *)0x0;
      local_1d0 = (void *)0x0;
      uStack_1c8 = 0;
      local_1c0 = 0;
      local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)pdVar2;
      local_238 = local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
      local_228 = pdVar2;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_1f8,&local_268);
      local_2c0 = (void *)0x0;
      uStack_2b8 = 0;
      local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)local_2b0;
      local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)local_2a8;
      if (-1 < (long)local_2a8 || local_2b0 == (undefined **)0x0) {
        mnf::Manifold::applyDiffRetractation(local_c8,&local_238,&local_1f8,&local_2d8);
        free(local_2c0);
        free(local_1d0);
        local_30 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
        ;
        local_28 = "";
        local_40 = &boost::unit_test::basic_cstring<char_const>::null;
        local_38 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x9c);
        local_240 = 1e-12;
        bVar1 = Eigen::internal::
                isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
                ::run(&local_288,&local_2a0,&local_240);
        local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)
               CONCAT71(local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data._1_7_,bVar1);
        local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = 0;
        local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             = 0;
        local_250 = "expectedRes.isApprox(J)";
        local_248 = "";
        pvStack_1f0 = (void *)((ulong)pvStack_1f0 & 0xffffffffffffff00);
        local_1f8 = &PTR__lazy_ostream_0012bc88;
        local_1e8 = &boost::unit_test::lazy_ostream::inst;
        local_50 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
        ;
        local_48 = "";
        paStack_1e0 = (assign_op<double,_double> *)&local_250;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols);
        free(local_2a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_2b0);
        free(local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        local_c8[0] = std::terminate;
        free(local_60);
        free(local_70);
        mnf::Manifold::~Manifold((Manifold *)local_c8);
        return;
      }
    }
    pcVar4 = 
    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar4);
}

Assistant:

BOOST_AUTO_TEST_CASE(RealApplyDiff)
{
  int c = 5;
  RealSpace Space(7);
  Index dim = Space.dim();
  Index repDim = Space.representationDim();
  Eigen::MatrixXd Jf = Eigen::MatrixXd::Random(c, repDim);
  Eigen::VectorXd x = Space.getZero().value();
  Space.retractation(x, x, Eigen::VectorXd::Random(dim));
  Eigen::MatrixXd expectedRes;
  expectedRes = Jf * Space.diffRetractation(x);
  Eigen::MatrixXd J(c, dim);
  Space.applyDiffRetractation(J, Jf, x);
  BOOST_CHECK(expectedRes.isApprox(J));
}